

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall
leveldb::Version::ForEachOverlapping
          (Version *this,Slice user_key,Slice internal_key,void *arg,
          _func_bool_void_ptr_int_FileMetaData_ptr *func)

{
  long lVar1;
  Comparator *pCVar2;
  pointer ppFVar3;
  FileMetaData *pFVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  long in_FS_OFFSET;
  Slice local_a0;
  Slice local_90;
  FileMetaData *f;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> tmp;
  Slice internal_key_local;
  Slice user_key_local;
  
  internal_key_local.size_ = internal_key.size_;
  internal_key_local.data_ = internal_key.data_;
  user_key_local.size_ = user_key.size_;
  user_key_local.data_ = user_key.data_;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = (this->vset_->icmp_).user_comparator_;
  tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
            (&tmp,(long)this->files_[0].
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)this->files_[0].
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3);
  uVar7 = 0;
  while( true ) {
    ppFVar3 = this->files_[0].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)this->files_[0].
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar3 >> 3) <=
        (ulong)uVar7) break;
    f = ppFVar3[uVar7];
    local_90 = InternalKey::user_key(&f->smallest);
    iVar6 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&user_key_local,&local_90);
    if (-1 < iVar6) {
      local_a0 = InternalKey::user_key(&f->largest);
      iVar6 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&user_key_local,&local_a0);
      if (iVar6 < 1) {
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                  (&tmp,&f);
      }
    }
    uVar7 = uVar7 + 1;
  }
  if (tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
LAB_0054cc53:
    files = this->files_;
    for (lVar8 = -6; files = files + 1, lVar8 != 0; lVar8 = lVar8 + 1) {
      lVar9 = (long)(files->
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(files->
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      if (lVar9 != 0) {
        uVar7 = FindFile(&this->vset_->icmp_,files,&internal_key_local);
        if ((ulong)uVar7 < (ulong)(lVar9 >> 3)) {
          pFVar4 = (files->
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar7];
          local_90 = InternalKey::user_key(&pFVar4->smallest);
          iVar6 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&user_key_local,&local_90);
          if (-1 < iVar6) {
            bVar5 = (*func)(arg,(int)lVar8 + 7,pFVar4);
            if (!bVar5) break;
          }
        }
      }
    }
  }
  else {
    std::
    __sort<__gnu_cxx::__normal_iterator<leveldb::FileMetaData**,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(leveldb::FileMetaData*,leveldb::FileMetaData*)>>
              ((__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                )tmp.
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                )tmp.
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
               (_Iter_comp_iter<bool_(*)(leveldb::FileMetaData_*,_leveldb::FileMetaData_*)>)0x54cd3e
              );
    uVar7 = 0;
    do {
      if ((ulong)((long)tmp.
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)tmp.
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)uVar7)
      goto LAB_0054cc53;
      bVar5 = (*func)(arg,0,tmp.
                            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar7]);
      uVar7 = uVar7 + 1;
    } while (bVar5);
  }
  std::_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
  ~_Vector_base(&tmp.
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               );
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Version::ForEachOverlapping(Slice user_key, Slice internal_key, void* arg,
                                 bool (*func)(void*, int, FileMetaData*)) {
  const Comparator* ucmp = vset_->icmp_.user_comparator();

  // Search level-0 in order from newest to oldest.
  std::vector<FileMetaData*> tmp;
  tmp.reserve(files_[0].size());
  for (uint32_t i = 0; i < files_[0].size(); i++) {
    FileMetaData* f = files_[0][i];
    if (ucmp->Compare(user_key, f->smallest.user_key()) >= 0 &&
        ucmp->Compare(user_key, f->largest.user_key()) <= 0) {
      tmp.push_back(f);
    }
  }
  if (!tmp.empty()) {
    std::sort(tmp.begin(), tmp.end(), NewestFirst);
    for (uint32_t i = 0; i < tmp.size(); i++) {
      if (!(*func)(arg, 0, tmp[i])) {
        return;
      }
    }
  }

  // Search other levels.
  for (int level = 1; level < config::kNumLevels; level++) {
    size_t num_files = files_[level].size();
    if (num_files == 0) continue;

    // Binary search to find earliest index whose largest key >= internal_key.
    uint32_t index = FindFile(vset_->icmp_, files_[level], internal_key);
    if (index < num_files) {
      FileMetaData* f = files_[level][index];
      if (ucmp->Compare(user_key, f->smallest.user_key()) < 0) {
        // All of "f" is past any data for user_key
      } else {
        if (!(*func)(arg, level, f)) {
          return;
        }
      }
    }
  }
}